

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aco_solver.cpp
# Opt level: O0

vector<imrt::Volume,_std::allocator<imrt::Volume>_> *
createVolumes(string *organ_filename,Collimator *collimator)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  ostream *this;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *this_00;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *pvVar7;
  reference pvVar8;
  value_type *in_RDX;
  Volume *in_RSI;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_RDI;
  int i;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  ifstream organ_file;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes;
  value_type *__x;
  value_type *in_stack_fffffffffffffcc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffd00;
  Collimator *in_stack_fffffffffffffd08;
  string local_2d0 [96];
  int local_270;
  string local_260 [39];
  byte local_239;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  long local_220 [65];
  value_type *local_18;
  
  local_18 = in_RDX;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar3,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x107820);
  local_239 = 0;
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)0x107832);
  std::__cxx11::string::string(local_260);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    in_stack_fffffffffffffd08 =
         (Collimator *)
         std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    in_stack_fffffffffffffd00 =
         (string *)std::operator<<((ostream *)in_stack_fffffffffffffd08,(string *)in_RSI);
    std::operator<<((ostream *)in_stack_fffffffffffffd00,", stopping! \n");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"##Reading volume files.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_220,local_260);
  while (bVar2 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18))), bVar2) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_220,local_260);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"##  ");
      poVar4 = std::operator<<(poVar4,local_260);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    }
  }
  std::ifstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"##  Read ");
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_238);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
  this = std::operator<<(poVar4," files");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_270 = 0;
  while( true ) {
    this_00 = (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)(long)local_270;
    pvVar7 = (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_238);
    if (pvVar7 <= this_00) break;
    __x = local_18;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_238,(long)local_270);
    std::__cxx11::string::string(local_2d0,(string *)pvVar8);
    imrt::Volume::Volume(in_RSI,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::push_back(this_00,__x);
    imrt::Volume::~Volume((Volume *)0x107ada);
    std::__cxx11::string::~string(local_2d0);
    local_270 = local_270 + 1;
  }
  local_239 = 1;
  std::__cxx11::string::~string(local_260);
  if ((local_239 & 1) == 0) {
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
              ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)poVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)poVar4);
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

vector<Volume> createVolumes (string organ_filename, Collimator& collimator){
  ifstream organ_file(organ_filename.c_str(), ios::in);
  vector<string> organ_files;
  vector<Volume> volumes;
  string line;

  if (! organ_file)
    cerr << "ERROR: unable to open instance file: " << organ_filename << ", stopping! \n";

  cout << "##Reading volume files." << endl;
  getline(organ_file, line);
  while (organ_file) {
    getline(organ_file, line);
    if (line.empty()) continue;
    cout << "##  " << line << endl;
    //Assuming one data point
    organ_files.push_back(line);
  }
  organ_file.close();
  cout << "##  Read " << organ_files.size() << " files"<< endl;

  for (int i=0; i<organ_files.size(); i++)
    volumes.push_back(Volume(collimator, organ_files[i]));

  return(volumes);
}